

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fade_group.cpp
# Opt level: O0

void Am_Get_Effects_Buffers
               (Am_Object *screen,unsigned_short buffer,Am_Drawonable **primary,Am_Drawonable **mask
               )

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  Am_Ptr pvVar4;
  Am_Drawonable *pAVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Am_Wrapper *pAVar6;
  byte local_ea;
  undefined1 local_d0 [8];
  Am_Value_List mask_list_2;
  Am_Value_List primary_list_2;
  Am_Value_List mask_list_1;
  Am_Value_List primary_list_1;
  Am_Style local_88;
  Am_Drawonable *local_80;
  Am_Drawonable *screen_drawonable;
  Am_Value_List mask_list;
  Am_Value_List primary_list;
  int i;
  undefined1 local_48 [8];
  Am_Value mask_value;
  Am_Value primary_value;
  Am_Drawonable **mask_local;
  Am_Drawonable **primary_local;
  unsigned_short buffer_local;
  Am_Object *screen_local;
  
  Am_Value::Am_Value((Am_Value *)&mask_value.value);
  Am_Value::Am_Value((Am_Value *)local_48);
  pAVar3 = Am_Object::Peek(screen,0x7d3,0);
  Am_Value::operator=((Am_Value *)&mask_value.value,pAVar3);
  pAVar3 = Am_Object::Peek(screen,0x7d4,0);
  Am_Value::operator=((Am_Value *)local_48,pAVar3);
  bVar1 = Am_Value_List::Test((Am_Value *)&mask_value.value);
  if (bVar1) {
    Am_Value_List::Am_Value_List((Am_Value_List *)&mask_list.item,(Am_Value *)&mask_value.value);
    Am_Value_List::Am_Value_List((Am_Value_List *)&screen_drawonable,(Am_Value *)local_48);
    Am_Value_List::Start((Am_Value_List *)&mask_list.item);
    Am_Value_List::Start((Am_Value_List *)&screen_drawonable);
    primary_list.item._0_4_ = 0;
    while( true ) {
      local_ea = 0;
      if ((int)primary_list.item < (int)(uint)buffer) {
        bVar1 = Am_Value_List::Last((Am_Value_List *)&mask_list.item);
        local_ea = bVar1 ^ 0xff;
      }
      if ((local_ea & 1) == 0) break;
      Am_Value_List::Next((Am_Value_List *)&mask_list.item);
      Am_Value_List::Next((Am_Value_List *)&screen_drawonable);
      primary_list.item._0_4_ = (int)primary_list.item + 1;
    }
    bVar1 = Am_Value_List::Last((Am_Value_List *)&mask_list.item);
    if (bVar1) {
      *primary = (Am_Drawonable *)0x0;
      *mask = (Am_Drawonable *)0x0;
    }
    else {
      pAVar3 = Am_Value_List::Get((Am_Value_List *)&mask_list.item);
      pvVar4 = Am_Value::operator_cast_to_void_(pAVar3);
      pAVar5 = Am_Drawonable::Narrow(pvVar4);
      *primary = pAVar5;
      pAVar3 = Am_Value_List::Get((Am_Value_List *)&screen_drawonable);
      pvVar4 = Am_Value::operator_cast_to_void_(pAVar3);
      pAVar5 = Am_Drawonable::Narrow(pvVar4);
      *mask = pAVar5;
    }
    Am_Value_List::~Am_Value_List((Am_Value_List *)&screen_drawonable);
    Am_Value_List::~Am_Value_List((Am_Value_List *)&mask_list.item);
  }
  else if (buffer == 0) {
    pvVar4 = Am_Value::operator_cast_to_void_((Am_Value *)&mask_value.value);
    pAVar5 = Am_Drawonable::Narrow(pvVar4);
    *primary = pAVar5;
    pvVar4 = Am_Value::operator_cast_to_void_((Am_Value *)local_48);
    pAVar5 = Am_Drawonable::Narrow(pvVar4);
    *mask = pAVar5;
  }
  else {
    *primary = (Am_Drawonable *)0x0;
    *mask = (Am_Drawonable *)0x0;
  }
  if (*primary == (Am_Drawonable *)0x0) {
    pAVar3 = Am_Object::Get(screen,0x7d2,0);
    pvVar4 = Am_Value::operator_cast_to_void_(pAVar3);
    pAVar5 = Am_Drawonable::Narrow(pvVar4);
    local_80 = pAVar5;
    Am_Style::Am_Style(&local_88,&Am_Off_Bits);
    iVar2 = (*pAVar5->_vptr_Am_Drawonable[2])(pAVar5,100,100,&local_88);
    *primary = (Am_Drawonable *)CONCAT44(extraout_var,iVar2);
    Am_Style::~Am_Style(&local_88);
    pAVar5 = local_80;
    Am_Style::Am_Style((Am_Style *)&primary_list_1.item,&Am_Off_Bits);
    iVar2 = (*pAVar5->_vptr_Am_Drawonable[2])(pAVar5,100,100,&primary_list_1.item);
    *mask = (Am_Drawonable *)CONCAT44(extraout_var_00,iVar2);
    Am_Style::~Am_Style((Am_Style *)&primary_list_1.item);
    bVar1 = Am_Value_List::Test((Am_Value *)&mask_value.value);
    if (bVar1) {
      Am_Value_List::Am_Value_List((Am_Value_List *)&mask_list_1.item,(Am_Value *)&mask_value.value)
      ;
      Am_Value_List::Am_Value_List((Am_Value_List *)&primary_list_2.item,(Am_Value *)local_48);
      Am_Value_List::Start((Am_Value_List *)&mask_list_1.item);
      Am_Value_List::Start((Am_Value_List *)&primary_list_2.item);
      for (primary_list.item._0_4_ = 0; (int)primary_list.item < (int)(uint)buffer;
          primary_list.item._0_4_ = (int)primary_list.item + 1) {
        bVar1 = Am_Value_List::Last((Am_Value_List *)&mask_list_1.item);
        if (bVar1) {
          Am_Value_List::Add((Am_Value_List *)&mask_list_1.item,(Am_Ptr)0x0,Am_TAIL,true);
          Am_Value_List::Add((Am_Value_List *)&primary_list_2.item,(Am_Ptr)0x0,Am_TAIL,true);
        }
        else {
          Am_Value_List::Next((Am_Value_List *)&mask_list_1.item);
          Am_Value_List::Next((Am_Value_List *)&primary_list_2.item);
        }
      }
      Am_Value_List::Set((Am_Value_List *)&mask_list_1.item,*primary,true);
      Am_Value_List::Set((Am_Value_List *)&primary_list_2.item,*mask,true);
      pAVar6 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)&mask_list_1.item);
      Am_Object::Set(screen,0x7d3,pAVar6,0);
      pAVar6 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)&primary_list_2.item);
      Am_Object::Set(screen,0x7d4,pAVar6,0);
      Am_Value_List::~Am_Value_List((Am_Value_List *)&primary_list_2.item);
      Am_Value_List::~Am_Value_List((Am_Value_List *)&mask_list_1.item);
    }
    else if (buffer == 0) {
      Am_Object::Set(screen,0x7d3,*primary,0);
      Am_Object::Set(screen,0x7d4,*mask,0);
    }
    else {
      Am_Value_List::Am_Value_List((Am_Value_List *)&mask_list_2.item);
      Am_Value_List::Am_Value_List((Am_Value_List *)local_d0);
      Am_Value_List::Add((Am_Value_List *)&mask_list_2.item,(Am_Value *)&mask_value.value,Am_TAIL,
                         true);
      Am_Value_List::Add((Am_Value_List *)local_d0,(Am_Value *)local_48,Am_TAIL,true);
      for (primary_list.item._0_4_ = 1; (int)primary_list.item < (int)(uint)buffer;
          primary_list.item._0_4_ = (int)primary_list.item + 1) {
        Am_Value_List::Add((Am_Value_List *)&mask_list_2.item,(Am_Ptr)0x0,Am_TAIL,true);
        Am_Value_List::Add((Am_Value_List *)local_d0,(Am_Ptr)0x0,Am_TAIL,true);
      }
      Am_Value_List::Add((Am_Value_List *)&mask_list_2.item,*primary,Am_TAIL,true);
      Am_Value_List::Add((Am_Value_List *)local_d0,*mask,Am_TAIL,true);
      pAVar6 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)&mask_list_2.item);
      Am_Object::Set(screen,0x7d3,pAVar6,0);
      pAVar6 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_d0);
      Am_Object::Set(screen,0x7d4,pAVar6,0);
      Am_Value_List::~Am_Value_List((Am_Value_List *)local_d0);
      Am_Value_List::~Am_Value_List((Am_Value_List *)&mask_list_2.item);
    }
  }
  Am_Value::~Am_Value((Am_Value *)local_48);
  Am_Value::~Am_Value((Am_Value *)&mask_value.value);
  return;
}

Assistant:

void
Am_Get_Effects_Buffers(Am_Object screen, unsigned short buffer,
                       Am_Drawonable *&primary, Am_Drawonable *&mask)
{
  Am_Value primary_value, mask_value;
  primary_value = screen.Peek(Am_DRAW_BUFFER);
  mask_value = screen.Peek(Am_MASK_BUFFER);
  int i;
  if (Am_Value_List::Test(primary_value)) {
    Am_Value_List primary_list = primary_value;
    Am_Value_List mask_list = mask_value;
    primary_list.Start();
    mask_list.Start();
    for (i = 0; (i < buffer) && !primary_list.Last(); ++i) {
      primary_list.Next();
      mask_list.Next();
    }
    if (primary_list.Last()) {
      primary = nullptr;
      mask = nullptr;
    } else {
      primary = Am_Drawonable::Narrow(primary_list.Get());
      mask = Am_Drawonable::Narrow(mask_list.Get());
    }
  } else if (buffer == 0) {
    primary = Am_Drawonable::Narrow(primary_value);
    mask = Am_Drawonable::Narrow(mask_value);
  } else {
    primary = nullptr;
    mask = nullptr;
  }
  if (!primary) {
    Am_Drawonable *screen_drawonable =
        Am_Drawonable::Narrow(screen.Get(Am_DRAWONABLE));
    primary = screen_drawonable->Create_Offscreen(100, 100, Am_Off_Bits);
    mask = screen_drawonable->Create_Offscreen(100, 100, Am_Off_Bits);
    if (Am_Value_List::Test(primary_value)) {
      Am_Value_List primary_list = primary_value;
      Am_Value_List mask_list = mask_value;
      primary_list.Start();
      mask_list.Start();
      for (i = 0; i < buffer; ++i) {
        if (primary_list.Last()) {
          primary_list.Add((Am_Ptr)nullptr);
          mask_list.Add((Am_Ptr)nullptr);
        } else {
          primary_list.Next();
          mask_list.Next();
        }
      }
      primary_list.Set((Am_Ptr)primary);
      mask_list.Set((Am_Ptr)mask);
      screen.Set(Am_DRAW_BUFFER, primary_list);
      screen.Set(Am_MASK_BUFFER, mask_list);
    } else if (buffer == 0) {
      screen.Set(Am_DRAW_BUFFER, (Am_Ptr)primary);
      screen.Set(Am_MASK_BUFFER, (Am_Ptr)mask);
    } else {
      Am_Value_List primary_list, mask_list;
      primary_list.Add(primary_value);
      mask_list.Add(mask_value);
      for (i = 1; i < buffer; ++i) {
        primary_list.Add((Am_Ptr)nullptr);
        mask_list.Add((Am_Ptr)nullptr);
      }
      primary_list.Add((Am_Ptr)primary);
      mask_list.Add((Am_Ptr)mask);
      screen.Set(Am_DRAW_BUFFER, primary_list);
      screen.Set(Am_MASK_BUFFER, mask_list);
    }
  }
}